

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void transsub(quadtype nextquad)

{
  char label [10];
  
  fwrite("; ",2,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op1.opnd);
  fwrite(" := ",4,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op2.opnd);
  fwrite(" - ",3,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op3.opnd);
  fputc(10,(FILE *)ofp);
  getjumplabel(label);
  emitfromone(opcmov,"ax",nextquad.op2.opnd);
  emitfromone(opcmov,"bx",nextquad.op3.opnd);
  fwrite("         sub       ax, bx\n",0x1a,1,(FILE *)ofp);
  emittoone(opcmov,nextquad.op1.opnd,"ax");
  fprintf((FILE *)ofp,"%s:\n\n",label);
  return;
}

Assistant:

void    transsub(struct quadtype nextquad)
{
    char    label[LABELSIZE];
    
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, " - ");
    fprintlexeme(ofp, nextquad.op3.opnd);
    fprintf(ofp, "\n");
    
    getjumplabel(label);
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emitfromone(opcmov, "bx", nextquad.op3.opnd);
    fprintf(ofp, "         sub       ax, bx\n");
    //  fprintf(ofp, "         jc        iovrflo\n");
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    fprintf(ofp, "%s:\n\n", label);
}